

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>
          (xpression_peeker<char> *this,
          string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
          *xpr)

{
  char *pcVar1;
  hash_peek_bitset<char> *in_RSI;
  xpression_peeker<char> *in_RDI;
  hash_peek_bitset<char> *str;
  undefined1 in_stack_ffffffffffffffee;
  bool_ in_stack_ffffffffffffffef;
  
  str = in_RDI->bset_;
  std::__cxx11::string::operator[]((ulong)in_RSI);
  mpl_::bool_::operator_cast_to_bool((bool_ *)&stack0xffffffffffffffef);
  get_traits_<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>(in_RDI)
  ;
  hash_peek_bitset<char>::
  set_char<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (in_RSI,(char_type)in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee,
             (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)in_RDI);
  pcVar1 = data_begin<char,std::char_traits<char>,std::allocator<char>>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14a4b4)
  ;
  (in_RDI->str_).begin_ = pcVar1;
  pcVar1 = data_end<char,std::char_traits<char>,std::allocator<char>>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
  (in_RDI->str_).end_ = pcVar1;
  (in_RDI->str_).icase_ = true;
  return;
}

Assistant:

mpl::false_ accept(string_matcher<Traits, ICase> const &xpr)
    {
        this->bset_.set_char(xpr.str_[0], ICase(), this->get_traits_<Traits>());
        this->str_.begin_ = detail::data_begin(xpr.str_);
        this->str_.end_ = detail::data_end(xpr.str_);
        this->str_.icase_ = ICase::value;
        return mpl::false_();
    }